

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * Catch::runTests(Totals *__return_storage_ptr__,Ptr<Catch::Config> *config)

{
  pointer pTVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  TestSpecParser *this;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *pvVar5;
  pointer testCase;
  Ptr<const_Catch::IConfig> iconfig;
  allocator local_319;
  Ptr<Catch::IStreamingReporter> reporter;
  Ptr<Catch::IStreamingReporter> local_310;
  TestSpec testSpec;
  string local_2f0;
  TestSpecParser local_2d0;
  TestSpec local_260;
  RunContext context;
  
  iconfig.m_p = (IConfig *)config->m_p;
  if ((Config *)iconfig.m_p != (Config *)0x0) {
    (*(((Config *)iconfig.m_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
      super_NonCopyable._vptr_NonCopyable[2])();
  }
  makeReporter((Catch *)&reporter,config);
  local_310 = (Ptr<Catch::IStreamingReporter>)(Ptr<Catch::IStreamingReporter>)reporter.m_p;
  if (reporter.m_p != (IStreamingReporter *)0x0) {
    (*((reporter.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  addListeners((Catch *)&context,&iconfig,&local_310);
  Ptr<Catch::IStreamingReporter>::operator=(&reporter,(Ptr<Catch::IStreamingReporter> *)&context);
  Ptr<Catch::IStreamingReporter>::~Ptr((Ptr<Catch::IStreamingReporter> *)&context);
  Ptr<Catch::IStreamingReporter>::~Ptr(&local_310);
  RunContext::RunContext(&context,&iconfig,&reporter);
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->testCases).failedButOk = 0;
  (__return_storage_ptr__->assertions).failedButOk = 0;
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  (*(config->m_p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
    _vptr_NonCopyable[6])(&local_2d0);
  RunContext::testGroupStarting(&context,(string *)&local_2d0,1,1);
  std::__cxx11::string::~string((string *)&local_2d0);
  iVar4 = (*(config->m_p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&testSpec.m_filters,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar4));
  if (testSpec.m_filters.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start ==
      testSpec.m_filters.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    TagAliasRegistry::get();
    local_2d0.m_arg._M_dataplus._M_p = (pointer)&local_2d0.m_arg.field_2;
    local_2d0.m_arg._M_string_length = 0;
    local_2d0.m_arg.field_2._M_local_buf[0] = '\0';
    local_2d0.m_currentFilter.m_patterns.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d0.m_currentFilter.m_patterns.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2d0.m_currentFilter.m_patterns.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2d0.m_testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d0.m_testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2d0.m_testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2d0.m_tagAliases = &TagAliasRegistry::get::instance.super_ITagAliasRegistry;
    std::__cxx11::string::string((string *)&local_2f0,"~[.]",&local_319);
    this = TestSpecParser::parse(&local_2d0,&local_2f0);
    TestSpecParser::testSpec(&local_260,this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::_M_move_assign
              (&testSpec.m_filters,&local_260);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_260.m_filters);
    std::__cxx11::string::~string((string *)&local_2f0);
    TestSpecParser::~TestSpecParser(&local_2d0);
  }
  pvVar5 = getAllTestCasesSorted(iconfig.m_p);
  testCase = (pvVar5->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl
             .super__Vector_impl_data._M_start;
  pTVar1 = (pvVar5->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    sVar2 = context.m_totals.assertions.failed;
    if (testCase == pTVar1) {
      (*((iconfig.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(&local_2d0);
      RunContext::testGroupEnded(&context,(string *)&local_2d0,__return_storage_ptr__,1,1);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
                (&testSpec.m_filters);
      RunContext::~RunContext(&context);
      Ptr<Catch::IStreamingReporter>::~Ptr(&reporter);
      Ptr<const_Catch::IConfig>::~Ptr(&iconfig);
      return __return_storage_ptr__;
    }
    iVar4 = (*((context.m_config.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
    if (sVar2 == (long)iVar4) {
LAB_0010b4b9:
      (*((reporter.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
                (reporter.m_p,testCase);
    }
    else {
      bVar3 = matchTest(testCase,&testSpec,iconfig.m_p);
      if (!bVar3) goto LAB_0010b4b9;
      RunContext::runTest((Totals *)&local_2d0,&context,testCase);
      Totals::operator+=(__return_storage_ptr__,(Totals *)&local_2d0);
    }
    testCase = testCase + 1;
  } while( true );
}

Assistant:

Totals runTests( Ptr<Config> const& config ) {

        Ptr<IConfig const> iconfig = config.get();

        Ptr<IStreamingReporter> reporter = makeReporter( config );
        reporter = addListeners( iconfig, reporter );

        RunContext context( iconfig, reporter );

        Totals totals;

        context.testGroupStarting( config->name(), 1, 1 );

        TestSpec testSpec = config->testSpec();
        if( !testSpec.hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

        std::vector<TestCase> const& allTestCases = getAllTestCasesSorted( *iconfig );
        for( std::vector<TestCase>::const_iterator it = allTestCases.begin(), itEnd = allTestCases.end();
                it != itEnd;
                ++it ) {
            if( !context.aborting() && matchTest( *it, testSpec, *iconfig ) )
                totals += context.runTest( *it );
            else
                reporter->skipTest( *it );
        }

        context.testGroupEnded( iconfig->name(), totals, 1, 1 );
        return totals;
    }